

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDynamicLoader.cxx
# Opt level: O0

string * GetLibName_abi_cxx11_(string *__return_storage_ptr__,char *lname,char *subdir)

{
  char *pcVar1;
  char *subdir_local;
  char *lname_local;
  string *slname;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/build_O0/Source/kwsys"
            );
  if (subdir != (char *)0x0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,subdir);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  pcVar1 = cmsys::DynamicLoader::LibPrefix();
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,lname);
  pcVar1 = cmsys::DynamicLoader::LibExtension();
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetLibName(const char* lname, const char* subdir = nullptr)
{
  // Construct proper name of lib
  std::string slname;
  slname = RUNTIME_OUTPUT_DIRECTORY;
  if (subdir) {
    slname += "/";
    slname += subdir;
  }
#ifdef CMAKE_INTDIR
  slname += "/";
  slname += CMAKE_INTDIR;
#endif
  slname += "/";
  slname += kwsys::DynamicLoader::LibPrefix();
  slname += lname;
  slname += kwsys::DynamicLoader::LibExtension();

  return slname;
}